

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flv.c
# Opt level: O3

int flvtag_avcwritenal(flvtag_t *tag,uint8_t *data,size_t size)

{
  uint uVar1;
  uint8_t *__ptr;
  ulong __size;
  ulong uVar2;
  
  if (size != 0) {
    __ptr = tag->data;
    uVar2 = (ulong)__ptr[3] | (ulong)((uint)__ptr[2] << 8 | (uint)__ptr[1] << 0x10);
    uVar1 = (uint)size;
    __size = (ulong)(uVar1 + (int)uVar2 + 0x13);
    if (tag->aloc < __size) {
      __ptr = (uint8_t *)realloc(__ptr,__size);
      tag->data = __ptr;
      tag->aloc = __size;
    }
    *(uint *)(__ptr + uVar2 + 0xb) =
         uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
    memcpy(__ptr + uVar2 + 0xf,data,size);
    flvtag_updatesize(tag,uVar1 + (int)uVar2 + 4);
  }
  return 1;
}

Assistant:

int flvtag_avcwritenal(flvtag_t* tag, uint8_t* data, size_t size)
{
    if (0 < size) {
        uint32_t flvsize = flvtag_size(tag);
        flvtag_reserve(tag, flvsize + LENGTH_SIZE + size);
        uint8_t* payload = tag->data + FLV_TAG_HEADER_SIZE + flvsize;
        payload[0] = size >> 24; // nalu size
        payload[1] = size >> 16;
        payload[2] = size >> 8;
        payload[3] = size >> 0;
        memcpy(&payload[LENGTH_SIZE], data, size);
        flvtag_updatesize(tag, flvsize + LENGTH_SIZE + size);
    }
    return 1;
}